

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.h
# Opt level: O2

void __thiscall Basic_Longer_Test::TestBody(Basic_Longer_Test *this)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  undefined1 local_190 [8];
  BigNumber num_2;
  BigNumber num_3;
  BigNumber num_4;
  BigNumber num_1;
  string numStr_1;
  string numStr_2;
  string numStr_3;
  string numStr_4;
  string local_68;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  num_1._32_8_ = &numStr_1._M_string_length;
  numStr_1._M_dataplus._M_p = (pointer)0x0;
  numStr_1._M_string_length._0_1_ = 0;
  std::__cxx11::string::string
            ((string *)(numStr_1.field_2._M_local_buf + 8),"-",(allocator *)&num_4.m_symbol);
  numStr_2.field_2._8_8_ = &numStr_3._M_string_length;
  numStr_3._M_dataplus._M_p = (pointer)0x0;
  numStr_3._M_string_length._0_1_ = 0;
  std::__cxx11::string::string
            ((string *)(numStr_3.field_2._M_local_buf + 8),"-",(allocator *)&num_4.m_symbol);
  iVar1 = 0x10000;
  while( true ) {
    bVar3 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar3) break;
    std::__cxx11::string::push_back((char)&num_1 + ' ');
    std::__cxx11::string::push_back((char)&numStr_1 + '\x18');
    std::__cxx11::string::push_back((char)&numStr_2 + '\x18');
    std::__cxx11::string::push_back((char)&numStr_3 + '\x18');
  }
  BigNumber::BigNumber((BigNumber *)&num_4.m_symbol,(string *)&num_1.m_symbol);
  BigNumber::BigNumber((BigNumber *)local_190,(string *)((long)&numStr_1.field_2 + 8));
  BigNumber::BigNumber((BigNumber *)&num_2.m_symbol,(string *)((long)&numStr_2.field_2 + 8));
  BigNumber::BigNumber((BigNumber *)&num_3.m_symbol,(string *)((long)&numStr_3.field_2 + 8));
  BigNumber::toString_abi_cxx11_(&local_68,(BigNumber *)&num_4.m_symbol);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"numStr_1","num_1.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_1.m_symbol,
             &local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::toString_abi_cxx11_(&local_68,(BigNumber *)local_190);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"numStr_2","num_2.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_1.field_2 + 8),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::toString_abi_cxx11_(&local_68,(BigNumber *)&num_2.m_symbol);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"numStr_3","num_3.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_2.field_2 + 8),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::toString_abi_cxx11_(&local_68,(BigNumber *)&num_3.m_symbol);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"numStr_4","num_4.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_3.field_2 + 8),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  BigNumber::~BigNumber((BigNumber *)local_190);
  BigNumber::~BigNumber((BigNumber *)&num_4.m_symbol);
  std::__cxx11::string::~string((string *)(numStr_3.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(numStr_2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(numStr_1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&num_1.m_symbol);
  return;
}

Assistant:

TEST(Basic, Longer)
{
    std::string numStr_1, numStr_2 = "-", numStr_3, numStr_4 = "-";
    for (int i = 1; i <= 65536; i++)
    {
        numStr_1 += (i % 9) + '0';
        numStr_2 += (i % 7) + '0';
        numStr_3 += (i % 5) + '0';
        numStr_4 += (i % 3) + '0';
    }
    BigNumber num_1 = numStr_1;
    BigNumber num_2 = numStr_2;
    BigNumber num_3 = numStr_3;
    BigNumber num_4 = numStr_4;
    EXPECT_EQ(numStr_1, num_1.toString());
    EXPECT_EQ(numStr_2, num_2.toString());
    EXPECT_EQ(numStr_3, num_3.toString());
    EXPECT_EQ(numStr_4, num_4.toString());
}